

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderBase::unRleAc
          (LossyDctDecoderBase *this,unsigned_short **currAcComp,unsigned_short *halfZigBlock)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  ushort *puVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = 0;
  iVar7 = 1;
  puVar2 = *currAcComp;
  iVar3 = this->_packedAcCount;
  do {
    iVar6 = iVar3;
    puVar5 = puVar2;
    uVar1 = *puVar5;
    if (uVar1 == 0xff00) break;
    if ((~uVar1 & 0xff00) == 0) {
      iVar3 = iVar7 + (uint)(byte)uVar1;
    }
    else {
      halfZigBlock[iVar7] = uVar1;
      iVar3 = iVar7 + 1;
      iVar4 = iVar7;
    }
    iVar7 = iVar3;
    puVar2 = puVar5 + 1;
    iVar3 = iVar6 + 1;
  } while (iVar7 < 0x40);
  *currAcComp = puVar5 + 1;
  this->_packedAcCount = iVar6 + 1;
  return iVar4;
}

Assistant:

int 
DwaCompressor::LossyDctDecoderBase::unRleAc
    (unsigned short *&currAcComp,
     unsigned short  *halfZigBlock) 
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbaitm.
    //

    int lastNonZero          = 0;
    int dctComp              = 1; 

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (*currAcComp == 0xff00)
        {
            // 
            // End of block
            //

            dctComp = 64;

        }
        else if ((*currAcComp) >> 8 == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            // 

            dctComp += (*currAcComp) & 0xff; 
        }
        else
        {
            // 
            // Not a run, just copy over the value
            //

            lastNonZero = dctComp;
            halfZigBlock[dctComp] = *currAcComp;

            dctComp++;
        }

        _packedAcCount++;
        currAcComp++;
    }

    return lastNonZero;
}